

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::
ReadPropertyWithExplicitDefault<duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *ret,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *default_value)

{
  char cVar1;
  undefined6 in_register_00000032;
  shared_ptr<duckdb::ParquetEncryptionConfig,_true> sStack_28;
  
  cVar1 = (**(code **)(*(long *)this + 0x20))(this,CONCAT62(in_register_00000032,field_id));
  if (cVar1 != '\0') {
    Read<duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>>((Deserializer *)&sStack_28);
    shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator=(ret,&sStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_28.internal.
                super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (**(code **)(*(long *)this + 0x28))(this,1);
    return;
  }
  shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator=(ret,default_value);
  (**(code **)(*(long *)this + 0x28))(this,0);
  return;
}

Assistant:

inline void ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T &ret, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(default_value);
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}